

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IRenderPass,_Diligent::SerializationDeviceImpl,_Diligent::RenderPassDesc>
::~DeviceObjectBase(DeviceObjectBase<Diligent::IRenderPass,_Diligent::SerializationDeviceImpl,_Diligent::RenderPassDesc>
                    *this)

{
  ~DeviceObjectBase(this);
  free(this);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }